

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# witness.h
# Opt level: O0

void witness_lock(witness_tsdn_t *witness_tsdn,witness_t *witness)

{
  witness_t *w;
  witness_list_t *witnesses;
  witness_tsd_t *witness_tsd;
  witness_t *witness_local;
  witness_tsdn_t *witness_tsdn_local;
  
  return;
}

Assistant:

static inline void
witness_lock(witness_tsdn_t *witness_tsdn, witness_t *witness) {
	witness_tsd_t *witness_tsd;
	witness_list_t *witnesses;
	witness_t *w;

	if (!config_debug) {
		return;
	}

	if (witness_tsdn_null(witness_tsdn)) {
		return;
	}
	witness_tsd = witness_tsdn_tsd(witness_tsdn);
	if (witness->rank == WITNESS_RANK_OMIT) {
		return;
	}

	witness_assert_not_owner(witness_tsdn, witness);

	witnesses = &witness_tsd->witnesses;
	w = ql_last(witnesses, link);
	if (w == NULL) {
		/* No other locks; do nothing. */
	} else if (witness_tsd->forking && w->rank <= witness->rank) {
		/* Forking, and relaxed ranking satisfied. */
	} else if (w->rank > witness->rank) {
		/* Not forking, rank order reversal. */
		witness_lock_error(witnesses, witness);
	} else if (w->rank == witness->rank && (w->comp == NULL || w->comp !=
	    witness->comp || w->comp(w, w->opaque, witness, witness->opaque) >
	    0)) {
		/*
		 * Missing/incompatible comparison function, or comparison
		 * function indicates rank order reversal.
		 */
		witness_lock_error(witnesses, witness);
	}

	/* Suppress spurious warning from static analysis */
	assert(ql_empty(witnesses) ||
	    qr_prev(ql_first(witnesses), link) != NULL);
	ql_elm_new(witness, link);
	ql_tail_insert(witnesses, witness, link);
}